

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall phosg::Image::set_channel_width(Image *this,uint8_t new_width)

{
  byte bVar1;
  ushort uVar2;
  undefined4 uVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  runtime_error *this_00;
  void *pvVar7;
  ulong uVar8;
  uint64_t uVar9;
  int iVar10;
  uint64_t v;
  size_t z;
  size_t value_count;
  DataPtrs new_data;
  uint8_t new_width_local;
  Image *this_local;
  
  if ((((new_width != '\b') && (new_width != '\x10')) && (new_width != ' ')) && (new_width != '@'))
  {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this_00,"channel width must be 8, 16, 32, or 64");
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (this->channel_width != new_width) {
    pvVar7 = malloc(this->width * this->height * (long)(int)((this->has_alpha & 1) + 3) *
                    (long)(int)(new_width / 8));
    lVar4 = this->width;
    lVar5 = this->height;
    iVar10 = 3;
    if ((this->has_alpha & 1U) != 0) {
      iVar10 = 4;
    }
    for (v = 0; v < (ulong)(lVar4 * lVar5 * (long)iVar10); v = v + 1) {
      if (this->channel_width == '\b') {
        bVar1 = *(byte *)((long)(this->data).raw + v);
        uVar8 = (ulong)bVar1;
        if (new_width == '\x10') {
          *(ushort *)((long)pvVar7 + v * 2) = CONCAT11(bVar1,bVar1);
        }
        else if (new_width == ' ') {
          *(uint *)((long)pvVar7 + v * 4) =
               (uint)bVar1 << 0x18 | (uint)bVar1 << 0x10 | (uint)bVar1 << 8 | (uint)bVar1;
        }
        else if (new_width == '@') {
          *(ulong *)((long)pvVar7 + v * 8) =
               uVar8 << 0x38 | uVar8 << 0x30 | uVar8 << 0x28 | uVar8 << 0x20 | uVar8 << 0x18 |
               uVar8 << 0x10 | uVar8 << 8 | uVar8;
        }
      }
      else if (this->channel_width == '\x10') {
        uVar2 = *(ushort *)((long)(this->data).raw + v * 2);
        uVar8 = (ulong)uVar2;
        if (new_width == '\b') {
          *(char *)((long)pvVar7 + v) = (char)(uVar2 >> 8);
        }
        else if (new_width == ' ') {
          *(uint *)((long)pvVar7 + v * 4) = CONCAT22(uVar2,uVar2);
        }
        else if (new_width == '@') {
          *(ulong *)((long)pvVar7 + v * 8) = uVar8 << 0x30 | uVar8 << 0x20 | uVar8 << 0x10 | uVar8;
        }
      }
      else if (this->channel_width == ' ') {
        uVar3 = *(undefined4 *)((long)(this->data).raw + v * 4);
        if (new_width == '\b') {
          *(char *)((long)pvVar7 + v) = (char)((uint)uVar3 >> 0x18);
        }
        else if (new_width == '\x10') {
          *(short *)((long)pvVar7 + v * 2) = (short)((uint)uVar3 >> 0x10);
        }
        else if (new_width == '@') {
          *(ulong *)((long)pvVar7 + v * 8) = CONCAT44(uVar3,uVar3);
        }
      }
      else if (this->channel_width == '@') {
        uVar6 = *(undefined8 *)((long)(this->data).raw + v * 8);
        if (new_width == '\b') {
          *(char *)((long)pvVar7 + v) = (char)((ulong)uVar6 >> 0x38);
        }
        else if (new_width == '\x10') {
          *(short *)((long)pvVar7 + v * 2) = (short)((ulong)uVar6 >> 0x30);
        }
        else if (new_width == ' ') {
          *(int *)((long)pvVar7 + v * 4) = (int)((ulong)uVar6 >> 0x20);
        }
      }
    }
    free((this->data).raw);
    (this->data).raw = pvVar7;
    this->channel_width = new_width;
    uVar9 = mask_for_width(this->channel_width);
    this->max_value = uVar9;
  }
  return;
}

Assistant:

void Image::set_channel_width(uint8_t new_width) {
  if (new_width != 8 && new_width != 16 && new_width != 32 && new_width != 64) {
    throw runtime_error("channel width must be 8, 16, 32, or 64");
  }
  if (this->channel_width == new_width) {
    return;
  }

  DataPtrs new_data;
  new_data.raw = malloc(this->width * this->height * (3 + this->has_alpha) * (new_width / 8));

  size_t value_count = this->width * this->height * (this->has_alpha ? 4 : 3);
  for (size_t z = 0; z < value_count; z++) {
    uint64_t v;
    // If the new channel width is larger than the current width, expand the
    // channels by copying the now-high bits to the lower bits. If the new
    // channel width is smaller, preserve only the high bits of the original
    // values.
    if (this->channel_width == 8) {
      v = this->data.as8[z];
      if (new_width == 16) {
        new_data.as16[z] = (v << 8) | v;
      } else if (new_width == 32) {
        new_data.as32[z] = (v << 24) | (v << 16) | (v << 8) | v;
      } else if (new_width == 64) {
        new_data.as64[z] = (v << 56) | (v << 48) | (v << 40) | (v << 32) | (v << 24) | (v << 16) | (v << 8) | v;
      }

    } else if (this->channel_width == 16) {
      v = this->data.as16[z];
      if (new_width == 8) {
        new_data.as8[z] = v >> 8;
      } else if (new_width == 32) {
        new_data.as32[z] = (v << 16) | v;
      } else if (new_width == 64) {
        new_data.as64[z] = (v << 48) | (v << 32) | (v << 16) | v;
      }

    } else if (this->channel_width == 32) {
      v = this->data.as32[z];
      if (new_width == 8) {
        new_data.as8[z] = v >> 24;
      } else if (new_width == 16) {
        new_data.as16[z] = v >> 16;
      } else if (new_width == 64) {
        new_data.as64[z] = (v << 32) | v;
      }

    } else if (this->channel_width == 64) {
      v = this->data.as64[z];
      if (new_width == 8) {
        new_data.as8[z] = v >> 56;
      } else if (new_width == 16) {
        new_data.as16[z] = v >> 48;
      } else if (new_width == 32) {
        new_data.as32[z] = v >> 32;
      }
    }
  }

  free(this->data.raw);
  this->data.raw = new_data.raw;
  this->channel_width = new_width;
  this->max_value = mask_for_width(this->channel_width);
}